

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-math.h
# Opt level: O0

float wabt::interp::FloatSqrt<float>(float val)

{
  float fVar1;
  double dVar2;
  float val_local;
  
  dVar2 = std::sqrt((double)(ulong)(uint)val);
  fVar1 = CanonNaN<float,_0>(SUB84(dVar2,0));
  return fVar1;
}

Assistant:

T WABT_VECTORCALL FloatSqrt(T val) { return CanonNaN(std::sqrt(val)); }